

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O0

void HTS_PStream_backward_substitution(HTS_PStream *pst,size_t m)

{
  long lVar1;
  bool bVar2;
  size_t i;
  size_t t;
  size_t rev;
  size_t m_local;
  HTS_PStream *pst_local;
  
  for (rev = 0; rev < pst->length; rev = rev + 1) {
    lVar1 = (pst->length - 1) - rev;
    pst->par[lVar1][m] = (pst->sm).g[lVar1] / *(pst->sm).wuw[lVar1];
    i = 1;
    while( true ) {
      bVar2 = false;
      if (i < pst->width) {
        bVar2 = lVar1 + i < pst->length;
      }
      if (!bVar2) break;
      pst->par[lVar1][m] = -(pst->sm).wuw[lVar1][i] * pst->par[lVar1 + i][m] + pst->par[lVar1][m];
      i = i + 1;
    }
  }
  return;
}

Assistant:

static void HTS_PStream_backward_substitution(HTS_PStream * pst, size_t m)
{
   size_t rev, t, i;

   for (rev = 0; rev < pst->length; rev++) {
      t = pst->length - 1 - rev;
      pst->par[t][m] = pst->sm.g[t] / pst->sm.wuw[t][0];
      for (i = 1; (i < pst->width) && (t + i < pst->length); i++)
         pst->par[t][m] -= pst->sm.wuw[t][i] * pst->par[t + i][m];
   }
}